

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_overlay.cpp
# Opt level: O0

void __thiscall
r_exec::HLPOverlay::HLPOverlay(HLPOverlay *this,Controller *c,HLPBindingMap *bindings)

{
  HLPBindingMap *bindings_local;
  Controller *c_local;
  HLPOverlay *this_local;
  
  Overlay::Overlay(&this->super_Overlay,c,true);
  (this->super_Overlay).super__Object._vptr__Object = (_func_int **)&PTR__HLPOverlay_002ec0b0;
  core::P<r_exec::HLPBindingMap>::P(&this->bindings,bindings);
  r_code::list<core::P<r_exec::_Fact>_>::list(&this->patterns);
  return;
}

Assistant:

HLPOverlay::HLPOverlay(Controller *c, HLPBindingMap *bindings): Overlay(c, true), bindings(bindings)
{
}